

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O2

wchar_t apply_curse(object *obj,wchar_t lev)

{
  _Bool _Var1;
  int16_t iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  wchar_t power;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  uVar3 = Rand_div(4);
  uVar4 = Rand_div(9);
  iVar2 = m_bonus(9,lev);
  _Var1 = flag_has_dbg(obj->flags,6,0x12,"obj->flags","OF_BLESSED");
  if (!_Var1) {
    power = iVar2 * 10 + uVar4 + L'\x01';
    iVar5 = uVar3 + 1;
LAB_0019df36:
    bVar7 = iVar5 != 0;
    iVar5 = iVar5 + -1;
    if (bVar7) {
      iVar6 = -4;
      do {
        iVar6 = iVar6 + 1;
        if (iVar6 == 0) goto LAB_0019df36;
        uVar3 = Rand_div(z_info->curse_max - 1);
      } while (curses[uVar3 + L'\x01'].poss[obj->tval] != true);
      _Var1 = append_object_curse(obj,uVar3 + L'\x01',power);
      if (_Var1) {
        uVar3 = Rand_div(power / 10 + 1);
        lev = lev + uVar3 + L'\x01';
      }
      goto LAB_0019df36;
    }
  }
  return lev;
}

Assistant:

static int apply_curse(struct object *obj, int lev)
{
	int pick, max_curses = randint1(4);
	int power = randint1(9) + 10 * m_bonus(9, lev);
	int new_lev = lev;

	if (of_has(obj->flags, OF_BLESSED)) return lev;

	while (max_curses--) {
		/* Try to curse it */
		int tries = 3;
		while (tries--) {
			pick = randint1(z_info->curse_max - 1);
			if (curses[pick].poss[obj->tval]) {
				if (append_object_curse(obj, pick, power)) {
					new_lev += randint1(1 + power / 10);
				}
				break;
			}
		}
	}

	return new_lev;
}